

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O2

Abc_Obj_t * Lpk_Implement_rec(Lpk_Man_t *pMan,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,Lpk_Fun_t *pFun)

{
  Lpk_Fun_t *pFun_00;
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  int i;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if ((*(uint *)&pFun->field_0x8 >> 7 & 0x1f) <= uVar3) {
      pAVar2 = Lpk_ImplementFun(pMan,pNtk,vLeaves,pFun);
      Vec_PtrWriteEntry(vLeaves,*(uint *)&pFun->field_0x8 & 0x7f,(void *)((ulong)pAVar2 ^ 1));
      Lpk_FunFree(pFun);
      return pAVar2;
    }
    pFun_00 = (Lpk_Fun_t *)Vec_PtrEntry(vLeaves,(int)pFun->pFanins[uVar3]);
    if (((ulong)pFun_00 & 1) == 0) {
      Lpk_Implement_rec(pMan,pNtk,vLeaves,pFun_00);
    }
    pvVar1 = Vec_PtrEntry(vLeaves,(int)pFun->pFanins[uVar3]);
    uVar3 = uVar3 + 1;
  } while (((ulong)pvVar1 & 1) != 0);
  __assert_fail("Abc_ObjIsComplement(pFanin)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcDec.c"
                ,99,
                "Abc_Obj_t *Lpk_Implement_rec(Lpk_Man_t *, Abc_Ntk_t *, Vec_Ptr_t *, Lpk_Fun_t *)");
}

Assistant:

Abc_Obj_t * Lpk_Implement_rec( Lpk_Man_t * pMan, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, Lpk_Fun_t * pFun )
{
    Abc_Obj_t * pFanin, * pRes;
    int i;
    // prepare the leaves of the function
    for ( i = 0; i < (int)pFun->nVars; i++ )
    {
        pFanin = (Abc_Obj_t *)Vec_PtrEntry( vLeaves, pFun->pFanins[i] );
        if ( !Abc_ObjIsComplement(pFanin) )
            Lpk_Implement_rec( pMan, pNtk, vLeaves, (Lpk_Fun_t *)pFanin );
        pFanin = (Abc_Obj_t *)Vec_PtrEntry( vLeaves, pFun->pFanins[i] );
        assert( Abc_ObjIsComplement(pFanin) );
    }
    // construct the function
    pRes = Lpk_ImplementFun( pMan, pNtk, vLeaves, pFun );
    // replace the function
    Vec_PtrWriteEntry( vLeaves, pFun->Id, Abc_ObjNot(pRes) );
    Lpk_FunFree( pFun );
    return pRes;
}